

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.c
# Opt level: O0

upb_MiniTableField * upb_FieldDef_MiniTable(upb_FieldDef *f)

{
  _Bool _Var1;
  upb_FileDef *f_00;
  upb_MiniTable *puVar2;
  upb_MiniTable *layout;
  upb_FileDef *file;
  upb_FieldDef *f_local;
  
  _Var1 = upb_FieldDef_IsExtension(f);
  if (_Var1) {
    f_00 = upb_FieldDef_File(f);
    f_local = (upb_FieldDef *)_upb_FileDef_ExtensionMiniTable(f_00,(uint)f->layout_index);
  }
  else {
    puVar2 = upb_MessageDef_MiniTable(f->msgdef);
    f_local = (upb_FieldDef *)(puVar2->fields_dont_copy_me__upb_internal_use_only + f->layout_index)
    ;
  }
  return (upb_MiniTableField *)f_local;
}

Assistant:

const upb_MiniTableField* upb_FieldDef_MiniTable(const upb_FieldDef* f) {
  if (upb_FieldDef_IsExtension(f)) {
    const upb_FileDef* file = upb_FieldDef_File(f);
    return (upb_MiniTableField*)_upb_FileDef_ExtensionMiniTable(
        file, f->layout_index);
  } else {
    const upb_MiniTable* layout = upb_MessageDef_MiniTable(f->msgdef);
    return &layout->UPB_PRIVATE(fields)[f->layout_index];
  }
}